

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O1

void * err_unwind(lua_State *L,void *stopcf,int errcode)

{
  byte *pbVar1;
  ulong uVar2;
  code *pcVar3;
  TValue *in_RAX;
  uint uVar4;
  TValue *pTVar5;
  TValue *pTVar6;
  int iVar7;
  TValue *pTVar8;
  
  pTVar5 = (TValue *)L->cframe;
  pTVar6 = L->base + -1;
  do {
    if (pTVar5 == (TValue *)0x0) goto LAB_0010adbd;
    iVar7 = *(int *)(((ulong)pTVar5 & 0xfffffffffffffffc) + 8);
    if (iVar7 < 0) {
      pTVar8 = (TValue *)((ulong)(uint)-iVar7 + (L->stack).ptr64);
      if (pTVar6 < pTVar8) {
        in_RAX = pTVar5;
      }
      if (pTVar6 < pTVar8 && errcode != 0) {
        L->base = pTVar6 + 1;
        L->cframe = (void *)pTVar5[4];
        unwindstack(L,pTVar8);
        in_RAX = pTVar5;
      }
      iVar7 = 1;
      if (pTVar8 <= pTVar6) goto LAB_0010ac6b;
      goto LAB_0010ad8c;
    }
LAB_0010ac6b:
    iVar7 = 3;
    if (pTVar6 <= (TValue *)((L->stack).ptr64 + 8)) goto LAB_0010ad8c;
    uVar2 = pTVar6->u64;
    uVar4 = (uint)uVar2 & 7;
    switch(uVar4) {
    default:
      pTVar6 = pTVar6 + (-2 - (ulong)*(byte *)(uVar2 - 3));
      goto LAB_0010ad89;
    case 1:
switchD_0010ac99_caseD_1:
      if (errcode == 0) {
        if (pTVar5 != (TValue *)stopcf) {
          pTVar5 = (TValue *)pTVar5[4].u64;
          goto switchD_0010ac99_caseD_3;
        }
      }
      else {
        L->base = (TValue *)((long)pTVar6 + (8 - (uVar2 & 0xfffffffffffffff8)));
        L->cframe = (void *)pTVar5[4];
        unwindstack(L,pTVar6 + -1);
      }
      iVar7 = 1;
      in_RAX = (TValue *)0x0;
      break;
    case 2:
      if (pTVar6[-3].u64 == 1) goto switchD_0010ac99_caseD_1;
    case 3:
switchD_0010ac99_caseD_3:
      pTVar6 = (TValue *)((long)pTVar6 - (uVar2 & 0xfffffffffffffff8));
LAB_0010ad89:
      iVar7 = 0;
      break;
    case 5:
      iVar7 = 1;
      if (((ulong)pTVar5 & 1) == 0) {
        in_RAX = pTVar5;
        if (errcode != 0) {
          L->base = (TValue *)((long)pTVar6 + (8 - (uVar2 & 0xfffffffffffffff8)));
          L->cframe = (void *)pTVar5[4];
          unwindstack(L,pTVar6 + -1);
        }
      }
      else {
        in_RAX = pTVar5;
        if (errcode != 0) {
          pbVar1 = (byte *)((L->glref).ptr64 + 0x91);
          *pbVar1 = *pbVar1 & 0xef;
          L->cframe = (void *)0x0;
          L->status = (uint8_t)errcode;
        }
      }
      break;
    case 6:
    case 7:
      if (errcode != 0) {
        if (errcode == 1) goto switchD_0010ac99_caseD_3;
        if (uVar4 == 6) {
          pbVar1 = (byte *)((L->glref).ptr64 + 0x91);
          *pbVar1 = *pbVar1 & 0xef;
        }
        pTVar8 = (TValue *)((long)pTVar6 + (8 - (pTVar6->u64 & 0xfffffffffffffff8)));
        L->base = pTVar8;
        L->cframe = pTVar5;
        unwindstack(L,pTVar8);
      }
      iVar7 = 1;
      in_RAX = (TValue *)((ulong)pTVar5 | 2);
    }
LAB_0010ad8c:
  } while (iVar7 == 0);
  if (iVar7 == 3) {
LAB_0010adbd:
    in_RAX = (TValue *)L;
    if (errcode != 0) {
      pTVar5 = (TValue *)((L->stack).ptr64 + 0x10);
      L->base = pTVar5;
      L->cframe = (void *)0x0;
      unwindstack(L,pTVar5);
      pcVar3 = *(code **)((L->glref).ptr64 + 0x160);
      if (pcVar3 != (code *)0x0) {
        (*pcVar3)(L);
      }
      exit(1);
    }
  }
  return in_RAX;
}

Assistant:

static void *err_unwind(lua_State *L, void *stopcf, int errcode)
{
  TValue *frame = L->base-1;
  void *cf = L->cframe;
  while (cf) {
    int32_t nres = cframe_nres(cframe_raw(cf));
    if (nres < 0) {  /* C frame without Lua frame? */
      TValue *top = restorestack(L, -nres);
      if (frame < top) {  /* Frame reached? */
	if (errcode) {
	  L->base = frame+1;
	  L->cframe = cframe_prev(cf);
	  unwindstack(L, top);
	}
	return cf;
      }
    }
    if (frame <= tvref(L->stack)+LJ_FR2)
      break;
    switch (frame_typep(frame)) {
    case FRAME_LUA:  /* Lua frame. */
    case FRAME_LUAP:
      frame = frame_prevl(frame);
      break;
    case FRAME_C:  /* C frame. */
    unwind_c:
#if LJ_UNWIND_EXT
      if (errcode) {
	L->base = frame_prevd(frame) + 1;
	L->cframe = cframe_prev(cf);
	unwindstack(L, frame - LJ_FR2);
      } else if (cf != stopcf) {
	cf = cframe_prev(cf);
	frame = frame_prevd(frame);
	break;
      }
      return NULL;  /* Continue unwinding. */
#else
      UNUSED(stopcf);
      cf = cframe_prev(cf);
      frame = frame_prevd(frame);
      break;
#endif
    case FRAME_CP:  /* Protected C frame. */
      if (cframe_canyield(cf)) {  /* Resume? */
	if (errcode) {
	  hook_leave(G(L));  /* Assumes nobody uses coroutines inside hooks. */
	  L->cframe = NULL;
	  L->status = (uint8_t)errcode;
	}
	return cf;
      }
      if (errcode) {
	L->base = frame_prevd(frame) + 1;
	L->cframe = cframe_prev(cf);
	unwindstack(L, frame - LJ_FR2);
      }
      return cf;
    case FRAME_CONT:  /* Continuation frame. */
      if (frame_iscont_fficb(frame))
	goto unwind_c;
      /* fallthrough */
    case FRAME_VARG:  /* Vararg frame. */
      frame = frame_prevd(frame);
      break;
    case FRAME_PCALL:  /* FF pcall() frame. */
    case FRAME_PCALLH:  /* FF pcall() frame inside hook. */
      if (errcode) {
	if (errcode == LUA_YIELD) {
	  frame = frame_prevd(frame);
	  break;
	}
	if (frame_typep(frame) == FRAME_PCALL)
	  hook_leave(G(L));
	L->base = frame_prevd(frame) + 1;
	L->cframe = cf;
	unwindstack(L, L->base);
      }
      return (void *)((intptr_t)cf | CFRAME_UNWIND_FF);
    }
  }
  /* No C frame. */
  if (errcode) {
    L->base = tvref(L->stack)+1+LJ_FR2;
    L->cframe = NULL;
    unwindstack(L, L->base);
    if (G(L)->panic)
      G(L)->panic(L);
    exit(EXIT_FAILURE);
  }
  return L;  /* Anything non-NULL will do. */
}